

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O1

void __thiscall
wasm::AvoidReinterprets::optimize(wasm::Function*)::FinalOptimizer::visitLoad(wasm::Load__
          (void *this,Load *curr)

{
  Id IVar1;
  Index index;
  uintptr_t uVar2;
  Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *this_00;
  long lVar3;
  Memory *pMVar4;
  Expression *pEVar5;
  Load *value;
  Block *expression;
  long lVar6;
  long lVar7;
  bool bVar8;
  initializer_list<wasm::Expression_*> local_78;
  LocalSet *local_68;
  LocalSet *local_60;
  Load *local_58;
  Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *local_50;
  Expression *local_48;
  uintptr_t local_40;
  Builder local_38;
  Builder builder;
  
  lVar3 = *(long *)((long)this + 0xd8) + 8;
  lVar6 = lVar3;
  for (lVar7 = *(long *)(*(long *)((long)this + 0xd8) + 0x10); lVar7 != 0;
      lVar7 = *(long *)(lVar7 + 0x10 + (ulong)bVar8 * 8)) {
    bVar8 = *(Load **)(lVar7 + 0x20) < curr;
    if (!bVar8) {
      lVar6 = lVar7;
    }
  }
  lVar7 = lVar3;
  if ((lVar6 != lVar3) && (lVar7 = lVar6, curr < *(Load **)(lVar6 + 0x20))) {
    lVar7 = lVar3;
  }
  if (lVar7 != lVar3) {
    local_38.wasm = *(Module **)((long)this + 0xe8);
    local_48 = curr->ptr;
    local_50 = (Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)this;
    pMVar4 = Module::getMemory(*(Module **)((long)this + 0xd0),
                               (Name)(curr->memory).super_IString.str);
    uVar2 = (pMVar4->indexType).id;
    IVar1 = *(Id *)(lVar7 + 0x2c);
    local_40 = uVar2;
    pEVar5 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar5->_id = LocalGetId;
    pEVar5[1]._id = IVar1;
    (pEVar5->type).id = uVar2;
    curr->ptr = pEVar5;
    local_68 = Builder::makeLocalSet(&local_38,*(Index *)(lVar7 + 0x2c),local_48);
    IVar1 = *(Id *)(lVar7 + 0x2c);
    index = *(Index *)(lVar7 + 0x30);
    pEVar5 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    this_00 = local_50;
    pEVar5->_id = LocalGetId;
    pEVar5[1]._id = IVar1;
    (pEVar5->type).id = local_40;
    value = makeReinterpretedLoad(wasm::Load*,wasm::Expression__(local_50,curr,pEVar5);
    local_60 = Builder::makeLocalSet(&local_38,index,(Expression *)value);
    local_78._M_array = (iterator)&local_68;
    local_78._M_len = 3;
    local_58 = curr;
    expression = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                           (&local_38,&local_78);
    Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::replaceCurrent
              (this_00,(Expression *)expression);
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
        auto iter = infos.find(curr);
        if (iter != infos.end()) {
          auto& info = iter->second;
          Builder builder(*module);
          auto* ptr = curr->ptr;
          auto mem = getModule()->getMemory(curr->memory);
          auto indexType = mem->indexType;
          curr->ptr = builder.makeLocalGet(info.ptrLocal, indexType);
          // Note that the other load can have its sign set to false - if the
          // original were an integer, the other is a float anyhow; and if
          // original were a float, we don't know what sign to use.
          replaceCurrent(builder.makeBlock(
            {builder.makeLocalSet(info.ptrLocal, ptr),
             builder.makeLocalSet(
               info.reinterpretedLocal,
               makeReinterpretedLoad(
                 curr, builder.makeLocalGet(info.ptrLocal, indexType))),
             curr}));
        }
      }